

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::convertExpressionListToConstant
          (ConstantFolder *this,Expression *expr,Type *targetType,CommaSeparatedList *list)

{
  Context *errorContext;
  Allocator *pAVar1;
  undefined1 *puVar2;
  bool bVar3;
  int iVar4;
  ArraySize numberAvailable;
  Structure *this_00;
  Member *pMVar5;
  pool_ref<soul::AST::Expression> *ppVar6;
  Constant *pCVar7;
  Constant *pCVar8;
  CommaSeparatedList *list_00;
  Expression *pEVar9;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this_01;
  undefined8 extraout_RDX;
  complex<float> v;
  StructurePtr *this_02;
  Value *in_R8;
  size_t sVar10;
  ArrayView<soul::Value> members;
  ArrayView<soul::Value> elements;
  ArrayView<soul::Value> elements_00;
  complex<double> v_00;
  Constant *local_3b8;
  pool_ptr<soul::AST::Constant> constant_2;
  pool_ptr<soul::AST::Constant> imag;
  pool_ptr<soul::AST::Constant> constant;
  StructurePtr SStack_378;
  pool_ptr<soul::AST::Constant> constant_1;
  pool_ref<soul::AST::Expression> local_330;
  Type memberType;
  undefined1 local_2e8 [24];
  undefined1 local_2d0 [24];
  ArrayWithPreallocation<soul::Value,_8UL> memberValues;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  errorContext = &(expr->super_Statement).super_ASTObject.context;
  this_01 = &list->items;
  numberAvailable =
       TypeRules::checkArraySizeAndThrowErrorIfIllegal<soul::AST::Context&,unsigned_long>
                 (errorContext,(list->items).numActive);
  local_3b8 = (Constant *)expr;
  if (targetType->category == structure) {
    SanityCheckPass::throwErrorIfWrongNumberOfElements(errorContext,targetType,numberAvailable);
    this_00 = Type::getStructRef(targetType);
    memberValues.items = (Value *)memberValues.space;
    memberValues.numActive = 0;
    memberValues.numAllocated = 8;
    ArrayWithPreallocation<soul::Value,_8UL>::reserve(&memberValues,(this_00->members).numActive);
    sVar10 = 0;
    do {
      if (numberAvailable == sVar10) {
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        members.s = memberValues.items + memberValues.numActive;
        members.e = in_R8;
        soul::Value::createStruct
                  ((Value *)&constant_1,(Value *)this_00,(Structure *)memberValues.items,members);
        local_3b8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                              (&pAVar1->pool,errorContext,(Value *)&constant_1);
        soul::Value::~Value((Value *)&constant_1);
        break;
      }
      pMVar5 = ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                         (&this_00->members,sVar10);
      Type::Type(&memberType,&pMVar5->type);
      ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                         (this_01,sVar10);
      (*(ppVar6->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&constant);
      if (CONCAT44(constant.object._4_4_,constant.object._0_4_) == 0) {
LAB_0022a300:
        bVar3 = false;
      }
      else {
        pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant);
        iVar4 = (*(pCVar7->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[0x10])
                          (pCVar7,&memberType);
        if ((char)iVar4 == '\0') {
          if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors == false) {
            pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant);
            pCVar8 = pool_ptr<soul::AST::Constant>::operator*(&constant);
            SanityCheckPass::expectSilentCastPossible
                      (&(pCVar7->super_Expression).super_Statement.super_ASTObject.context,
                       &memberType,&pCVar8->super_Expression);
          }
          goto LAB_0022a300;
        }
        pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant);
        soul::Value::castToTypeExpectingSuccess((Value *)&constant_1,&pCVar7->value,&memberType);
        ArrayWithPreallocation<soul::Value,_8UL>::push_back(&memberValues,(Value *)&constant_1);
        soul::Value::~Value((Value *)&constant_1);
        bVar3 = true;
      }
      RefCountedPtr<soul::Structure>::~RefCountedPtr(&memberType.structure);
      sVar10 = sVar10 + 1;
    } while (bVar3);
    ArrayWithPreallocation<soul::Value,_8UL>::clear(&memberValues);
    return &local_3b8->super_Expression;
  }
  if ((targetType->category & ~primitive) == vector) {
    if (numberAvailable != 1) {
      SanityCheckPass::throwErrorIfWrongNumberOfElements(errorContext,targetType,numberAvailable);
      Type::getElementType(&memberType,targetType);
      memberValues.items = (Value *)memberValues.space;
      memberValues.numActive = 0;
      memberValues.numAllocated = 8;
      ArrayWithPreallocation<soul::Value,_8UL>::reserve(&memberValues,numberAvailable);
      for (sVar10 = 0; numberAvailable != sVar10; sVar10 = sVar10 + 1) {
        ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                           (this_01,sVar10);
        local_330.object = ppVar6->object;
        cast<soul::AST::CommaSeparatedList,soul::AST::Expression>((soul *)&constant,&local_330);
        if (CONCAT44(constant.object._4_4_,constant.object._0_4_) == 0) {
LAB_0022a6b4:
          ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                             (this_01,sVar10);
          (*(ppVar6->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                    ((soul *)&constant);
          if (CONCAT44(constant.object._4_4_,constant.object._0_4_) == 0) goto LAB_0022a972;
          pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant);
          bVar3 = TypeRules::canCastTo(&memberType,&(pCVar7->value).type);
          if (!bVar3) goto LAB_0022a972;
          pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant);
          soul::Value::castToTypeExpectingSuccess((Value *)&constant_1,&pCVar7->value,&memberType);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back(&memberValues,(Value *)&constant_1);
        }
        else {
          ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                             (this_01,sVar10);
          pEVar9 = ppVar6->object;
          list_00 = pool_ptr<soul::AST::CommaSeparatedList>::operator*
                              ((pool_ptr<soul::AST::CommaSeparatedList> *)&constant);
          pEVar9 = convertExpressionListToConstant(this,pEVar9,&memberType,list_00);
          cast<soul::AST::Constant,soul::AST::Expression>((soul *)&constant_2,pEVar9);
          if (constant_2.object == (Constant *)0x0) goto LAB_0022a6b4;
          pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_2);
          soul::Value::castToTypeExpectingSuccess((Value *)&constant_1,&pCVar7->value,&memberType);
          ArrayWithPreallocation<soul::Value,_8UL>::push_back(&memberValues,(Value *)&constant_1);
        }
        soul::Value::~Value((Value *)&constant_1);
      }
      if ((targetType->category == array) && (targetType->boundingSize == 0)) {
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        Type::createCopyWithNewArraySize((Type *)local_2d0,targetType,numberAvailable);
        elements.s = memberValues.items + memberValues.numActive;
        elements.e = in_R8;
        soul::Value::createArrayOrVector
                  ((Value *)&constant_1,(Value *)local_2d0,&(memberValues.items)->type,elements);
        local_3b8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                              (&pAVar1->pool,errorContext,(Value *)&constant_1);
        soul::Value::~Value((Value *)&constant_1);
        puVar2 = local_2d0;
      }
      else {
        if (numberAvailable != 0) {
          SanityCheckPass::throwErrorIfWrongNumberOfElements
                    (errorContext,targetType,numberAvailable);
        }
        pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
        Type::Type((Type *)local_2e8,targetType);
        elements_00.s = memberValues.items + memberValues.numActive;
        elements_00.e = in_R8;
        soul::Value::createArrayOrVector
                  ((Value *)&constant_1,(Value *)local_2e8,&(memberValues.items)->type,elements_00);
        local_3b8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                              (&pAVar1->pool,errorContext,(Value *)&constant_1);
        soul::Value::~Value((Value *)&constant_1);
        puVar2 = local_2e8;
      }
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)(puVar2 + 0x10));
LAB_0022a972:
      ArrayWithPreallocation<soul::Value,_8UL>::clear(&memberValues);
      this_02 = &memberType.structure;
LAB_0022a987:
      RefCountedPtr<soul::Structure>::~RefCountedPtr(this_02);
      return &local_3b8->super_Expression;
    }
    ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front(this_01);
    (*(ppVar6->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&constant_1);
    if (constant_1.object == (Constant *)0x0) {
      return expr;
    }
    pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_1);
    bVar3 = TypeRules::canCastTo(targetType,&(pCVar7->value).type);
    if (!bVar3) {
      return expr;
    }
    pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_1);
    soul::Value::castToTypeExpectingSuccess((Value *)&memberValues,&pCVar7->value,targetType);
    local_3b8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                          (&pAVar1->pool,errorContext,(Value *)&memberValues);
  }
  else {
    if ((targetType->primitiveType).type - complex32 < 2) {
      if (numberAvailable != 2) {
        Errors::wrongNumberOfComplexInitialisers<>();
        AST::Context::throwError(errorContext,&local_68,false);
      }
      ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                         (this_01,0);
      (*(ppVar6->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&constant_2);
      ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::operator[]
                         (this_01,1);
      (*(ppVar6->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&imag);
      if (constant_2.object == (Constant *)0x0) {
        return expr;
      }
      if (imag.object == (Constant *)0x0) {
        return expr;
      }
      constant.object._4_4_ = (targetType->primitiveType).type == complex32 ^ 3;
      constant.object._0_4_ = 1;
      SStack_378.object = (Structure *)0x0;
      pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_2);
      pCVar8 = pool_ptr<soul::AST::Constant>::operator*(&constant_2);
      SanityCheckPass::expectSilentCastPossible
                (&(pCVar7->super_Expression).super_Statement.super_ASTObject.context,
                 (Type *)&constant,&pCVar8->super_Expression);
      pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&imag);
      pCVar8 = pool_ptr<soul::AST::Constant>::operator*(&imag);
      SanityCheckPass::expectSilentCastPossible
                (&(pCVar7->super_Expression).super_Statement.super_ASTObject.context,
                 (Type *)&constant,&pCVar8->super_Expression);
      pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_2);
      soul::Value::castToTypeExpectingSuccess
                ((Value *)&memberValues,&pCVar7->value,(Type *)&constant);
      pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&imag);
      v._M_value = (_ComplexT)&pCVar7->value;
      soul::Value::castToTypeExpectingSuccess
                ((Value *)&constant_1,(Value *)v._M_value,(Type *)&constant);
      if ((targetType->primitiveType).type == complex32) {
        soul::Value::getAsFloat((Value *)&memberValues);
        soul::Value::getAsFloat((Value *)&constant_1);
        soul::Value::Value((Value *)&memberType,v);
      }
      else {
        soul::Value::getAsDouble((Value *)&memberValues);
        soul::Value::getAsDouble((Value *)&constant_1);
        v_00._M_value._8_8_ = extraout_RDX;
        v_00._M_value._0_8_ = v._M_value;
        soul::Value::Value((Value *)&memberType,v_00);
      }
      local_3b8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value&>
                            (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,
                             errorContext,(Value *)&memberType);
      soul::Value::~Value((Value *)&memberType);
      soul::Value::~Value((Value *)&constant_1);
      soul::Value::~Value((Value *)&memberValues);
      this_02 = &SStack_378;
      goto LAB_0022a987;
    }
    if (1 < numberAvailable) {
      Errors::wrongTypeForInitialiseList<>();
      AST::Context::throwError(errorContext,&local_a0,false);
    }
    ppVar6 = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::front(this_01);
    (*(ppVar6->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&constant_1);
    if (constant_1.object == (Constant *)0x0) {
      return expr;
    }
    pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_1);
    bVar3 = TypeRules::canCastTo(targetType,&(pCVar7->value).type);
    if (!bVar3) {
      return expr;
    }
    pAVar1 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    pCVar7 = pool_ptr<soul::AST::Constant>::operator->(&constant_1);
    soul::Value::castToTypeExpectingSuccess((Value *)&memberValues,&pCVar7->value,targetType);
    local_3b8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                          (&pAVar1->pool,errorContext,(Value *)&memberValues);
  }
  soul::Value::~Value((Value *)&memberValues);
  return &local_3b8->super_Expression;
}

Assistant:

AST::Expression& convertExpressionListToConstant (AST::Expression& expr, soul::Type& targetType, AST::CommaSeparatedList& list) const
        {
            auto numArgs = TypeRules::checkArraySizeAndThrowErrorIfIllegal (expr.context, list.items.size());

            if (targetType.isStruct())
            {
                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto& s = targetType.getStructRef();

                ArrayWithPreallocation<Value, 8> memberValues;
                memberValues.reserve (s.getNumMembers());

                for (size_t i = 0; i < numArgs; ++i)
                {
                    auto memberType = s.getMemberType (i);

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (constant->canSilentlyCastTo (memberType))
                        {
                            memberValues.push_back (constant->value.castToTypeExpectingSuccess (memberType));
                            continue;
                        }

                        if (! ignoreErrors)
                            SanityCheckPass::expectSilentCastPossible (constant->context, memberType, *constant);
                    }

                    return expr;
                }

                return allocator.allocate<AST::Constant> (expr.context, Value::createStruct (s, memberValues));
            }
            else if (targetType.isArrayOrVector())
            {
                if (numArgs == 1)
                {
                    if (auto constant = list.items.front()->getAsConstant())
                        if (TypeRules::canCastTo (targetType, constant->value.getType()))
                            return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

                    return expr;
                }

                SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                auto elementType = targetType.getElementType();

                ArrayWithPreallocation<Value, 8> elementValues;
                elementValues.reserve (numArgs);

                for (size_t i = 0; i < numArgs; ++i)
                {
                    if (auto itemList = cast<AST::CommaSeparatedList> (list.items[i]))
                    {
                        auto& e = convertExpressionListToConstant (list.items[i], elementType, *itemList);

                        if (auto constant = cast<AST::Constant> (e))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    if (auto constant = list.items[i]->getAsConstant())
                    {
                        if (TypeRules::canCastTo (elementType, constant->value.getType()))
                        {
                            elementValues.push_back (constant->value.castToTypeExpectingSuccess (elementType));
                            continue;
                        }
                    }

                    return expr;
                }

                if (targetType.isUnsizedArray())
                    return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType.createCopyWithNewArraySize (numArgs),
                                                                                                     elementValues));

                if (numArgs > 1)
                    SanityCheckPass::throwErrorIfWrongNumberOfElements (expr.context, targetType, numArgs);

                return allocator.allocate<AST::Constant> (expr.context, Value::createArrayOrVector (targetType, elementValues));
            }
            else if (targetType.isComplex())
            {
                if (numArgs != 2)
                    expr.context.throwError (Errors::wrongNumberOfComplexInitialisers());

                auto real = list.items[0]->getAsConstant();
                auto imag = list.items[1]->getAsConstant();

                if (real == nullptr || imag == nullptr)
                    return expr;

                auto attributeType = Type (targetType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64);

                SanityCheckPass::expectSilentCastPossible (real->context, attributeType, *real);
                SanityCheckPass::expectSilentCastPossible (imag->context, attributeType, *imag);

                auto realValue = real->value.castToTypeExpectingSuccess (attributeType);
                auto imagValue = imag->value.castToTypeExpectingSuccess (attributeType);

                auto value = targetType.isComplex32() ? Value (std::complex<float> (realValue.getAsFloat(), imagValue.getAsFloat()))
                                                      : Value (std::complex<double> (realValue.getAsDouble(), imagValue.getAsDouble()));

                return allocator.allocate<AST::Constant> (expr.context, value);
            }

            if (numArgs > 1)
                expr.context.throwError (Errors::wrongTypeForInitialiseList());

            if (auto constant = list.items.front()->getAsConstant())
                if (TypeRules::canCastTo (targetType, constant->value.getType()))
                    return allocator.allocate<AST::Constant> (expr.context, constant->value.castToTypeExpectingSuccess (targetType));

            return expr;
        }